

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotest.c
# Opt level: O3

void subtest(char *name,_func_void *cb)

{
  test_t *ptVar1;
  test_t test;
  test_t local_28;
  
  ptVar1 = cur_tests;
  cur_tests = &local_28;
  local_28.num_tests = 0;
  local_28.failed = 0;
  test_level = test_level + 1;
  note("Subtest: %s",name);
  (*cb)();
  done_testing();
  test_level = test_level + -1;
  cur_tests = ptVar1;
  if (local_28.failed != 0) {
    ptVar1->failed = 1;
  }
  _ok((uint)(local_28.failed == 0),"%s",name);
  return;
}

Assistant:

void subtest(const char *name, void (*cb)(void))
{
    struct test_t test = {0}, *parent_tests;

    parent_tests = cur_tests;
    cur_tests = &test;
    ++test_level;

    note("Subtest: %s", name);

    cb();

    done_testing();

    --test_level;
    cur_tests = parent_tests;
    if (test.failed)
        cur_tests->failed = 1;
    _ok(! test.failed, "%s", name);
}